

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_exporttype_t::wasm_exporttype_t(wasm_exporttype_t *this,wasm_exporttype_t *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer *__ptr;
  ExportType local_50;
  
  paVar1 = &local_50.name.field_2;
  pcVar2 = (other->I).name._M_dataplus._M_p;
  local_50.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (other->I).name._M_string_length);
  (*((other->I).type._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_50.type);
  wasm_exporttype_t(this,&local_50);
  if ((_Head_base<0UL,_wabt::interp::ExternType_*,_false>)
      local_50.type._M_t.
      super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
      .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::interp::ExternType_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_50.type._M_t.
        super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
        .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)[1])();
  }
  local_50.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>)
         0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.name._M_dataplus._M_p,local_50.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

wasm_exporttype_t(const wasm_exporttype_t& other)
      : wasm_exporttype_t(other.I) {}